

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# u16.c
# Opt level: O1

u16 u16NegInv(u16 w)

{
  short sVar1;
  u16 ret;
  
  sVar1 = (w * w | 2) * w;
  sVar1 = (sVar1 * w + 2) * sVar1;
  sVar1 = (sVar1 * w + 2) * sVar1;
  return (w * sVar1 + 2) * sVar1;
}

Assistant:

u16 u16NegInv(register u16 w)
{
	register u16 ret = w;
	ASSERT(w & 1);
	ret = ret * (w * ret + 2);
	ret = ret * (w * ret + 2);
	ret = ret * (w * ret + 2);
	ret = ret * (w * ret + 2);
	w = 0;
	return ret;
}